

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

PyObject * pybind11::cpp_function::dispatcher(PyObject *self,PyObject *args_in,PyObject *kwargs_in)

{
  _func_void_instance_ptr_void_ptr *p_Var1;
  undefined8 uVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  undefined8 *puVar6;
  PyObject *pPVar7;
  unsigned_long *puVar8;
  PyObject *pPVar9;
  long lVar10;
  size_type sVar11;
  PyObject **ppPVar12;
  reference pfVar13;
  handle *phVar14;
  char *pcVar15;
  ulong uVar16;
  ulong uVar17;
  size_t sVar18;
  undefined8 uVar19;
  type_info *ptVar20;
  bool bVar21;
  reference rVar22;
  reference rVar23;
  bool local_589;
  PyObject *local_578;
  PyTypeObject *local_560;
  type_info *tinfo;
  string local_548 [8];
  string msg_1;
  handle local_528;
  str local_520;
  str local_518 [4];
  handle local_4f8;
  value_type kwarg;
  dict_iterator __end5;
  dict_iterator __begin5;
  dict *__range5;
  handle hStack_498;
  bool first;
  dict local_490;
  dict kwargs_1;
  handle local_468;
  PyObject *local_460;
  str local_458;
  str local_450 [4];
  ulong local_430;
  size_t ti;
  handle hStack_420;
  bool some_args;
  tuple local_418;
  tuple args_;
  size_t ret;
  size_t next;
  size_t end;
  size_t start;
  string local_3e8 [8];
  string sig;
  __cxx11 local_3c0 [7];
  bool wrote_sig;
  string local_3a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380 [32];
  undefined8 *local_360;
  function_record *it2;
  int ctr;
  allocator local_329;
  string local_328 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8 [8];
  string msg;
  handle local_2a8 [2];
  error_already_set *e;
  _func_void_exception_ptr **translator;
  iterator __end3_1;
  iterator __begin3_1;
  forward_list<void_(*)(std::__exception_ptr::exception_ptr),_std::allocator<void_(*)(std::__exception_ptr::exception_ptr)>_>
  *__range3_1;
  forward_list<void_(*)(std::__exception_ptr::exception_ptr),_std::allocator<void_(*)(std::__exception_ptr::exception_ptr)>_>
  *registered_exception_translators;
  exception_ptr last_exception;
  reference_cast_error *anon_var_0_1;
  function_call *call_1;
  iterator __end3;
  iterator __begin3;
  vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
  *__range3;
  _Bit_type local_218;
  PyObject *local_210;
  size_t i_1;
  reference_cast_error *anon_var_0;
  undefined1 local_1f0 [8];
  vector<bool,_std::allocator<bool>_> second_pass_convert;
  tuple_accessor local_1c0;
  PyObject *local_1a0;
  handle local_198;
  handle item;
  size_t i;
  PyObject *local_180;
  size_t args_size;
  handle local_170;
  tuple local_168;
  value_type local_160;
  tuple extra_args;
  dict local_150;
  handle local_148;
  handle local_140;
  handle value;
  value_type *arg_1;
  handle hStack_128;
  bool copied_kwargs;
  handle local_120;
  dict kwargs;
  handle local_110;
  handle arg;
  argument_record *arg_rec;
  PyObject *pPStack_f8;
  bool bad_arg;
  size_t args_copied;
  size_t args_to_copy;
  undefined1 local_d0 [8];
  function_call call;
  size_t pos_args;
  function_record *func;
  undefined1 local_68 [7];
  bool overloaded;
  vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
  second_pass;
  handle result;
  handle parent;
  size_t n_args_in;
  function_record *it;
  function_record *overloads;
  PyObject *kwargs_in_local;
  PyObject *args_in_local;
  PyObject *self_local;
  
  puVar6 = (undefined8 *)PyCapsule_GetPointer(self,0);
  iVar5 = PyType_HasFeature(args_in->ob_type,0x4000000);
  if (iVar5 == 0) {
    __assert_fail("PyTuple_Check(args_in)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/shibasisp[P]pybind11-examples/pybind11/include/pybind11/pybind11.h"
                  ,0x1a0,
                  "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                 );
  }
  parent.m_ptr = (PyObject *)args_in[1].ob_refcnt;
  if (parent.m_ptr == (PyObject *)0x0) {
    local_560 = (PyTypeObject *)0x0;
  }
  else {
    iVar5 = PyType_HasFeature(args_in->ob_type,0x4000000);
    if (iVar5 == 0) {
      __assert_fail("PyTuple_Check(args_in)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/shibasisp[P]pybind11-examples/pybind11/include/pybind11/pybind11.h"
                    ,0x1a2,
                    "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                   );
    }
    local_560 = args_in[1].ob_type;
  }
  handle::handle(&result,(PyObject *)local_560);
  handle::handle((handle *)
                 &second_pass.
                  super__Vector_base<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(PyObject *)0x1);
  std::vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>::
  vector((vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
          *)local_68);
  bVar21 = false;
  n_args_in = (size_t)puVar6;
  if (puVar6 != (undefined8 *)0x0) {
    bVar21 = puVar6[0xf] != 0;
  }
  for (; n_args_in != 0; n_args_in = *(size_t *)(n_args_in + 0x78)) {
    call.parent.m_ptr = (PyObject *)(ulong)*(ushort *)(n_args_in + 0x5a);
    if ((*(byte *)(n_args_in + 0x59) >> 3 & 1) != 0) {
      call.parent.m_ptr = (PyObject *)((long)&call.parent.m_ptr[-1].ob_type + 7);
    }
    if ((*(byte *)(n_args_in + 0x59) >> 4 & 1) != 0) {
      call.parent.m_ptr = (PyObject *)((long)&call.parent.m_ptr[-1].ob_type + 7);
    }
    if ((((*(byte *)(n_args_in + 0x59) >> 3 & 1) != 0) || (parent.m_ptr <= call.parent.m_ptr)) &&
       ((call.parent.m_ptr <= parent.m_ptr ||
        (pPVar7 = (PyObject *)
                  std::
                  vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                  ::size((vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                          *)(n_args_in + 0x18)), call.parent.m_ptr <= pPVar7)))) {
      detail::function_call::function_call
                ((function_call *)local_d0,(function_record *)n_args_in,result);
      puVar8 = std::min<unsigned_long>((unsigned_long *)&call.parent,(unsigned_long *)&parent);
      pPVar7 = (PyObject *)*puVar8;
      bVar4 = false;
      for (pPStack_f8 = (PyObject *)0x0; pPStack_f8 < pPVar7;
          pPStack_f8 = (PyObject *)((long)&pPStack_f8->ob_refcnt + 1)) {
        pPVar9 = (PyObject *)
                 std::
                 vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                 ::size((vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                         *)(n_args_in + 0x18));
        if (pPStack_f8 < pPVar9) {
          local_578 = (PyObject *)
                      std::
                      vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                      ::operator[]((vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                    *)(n_args_in + 0x18),(size_type)pPStack_f8);
        }
        else {
          local_578 = (PyObject *)0x0;
        }
        arg.m_ptr = local_578;
        if ((((kwargs_in != (PyObject *)0x0) && (local_578 != (PyObject *)0x0)) &&
            (local_578->ob_refcnt != 0)) &&
           (lVar10 = PyDict_GetItemString(kwargs_in,local_578->ob_refcnt), lVar10 != 0)) {
          bVar4 = true;
          break;
        }
        iVar5 = PyType_HasFeature(args_in->ob_type,0x4000000);
        if (iVar5 == 0) {
          __assert_fail("PyTuple_Check(args_in)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/shibasisp[P]pybind11-examples/pybind11/include/pybind11/pybind11.h"
                        ,0x1dd,
                        "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                       );
        }
        handle::handle(&local_110,(PyObject *)(&args_in[1].ob_type)[(long)pPStack_f8]);
        if (((arg.m_ptr != (PyObject *)0x0) && ((*(byte *)&arg.m_ptr[1].ob_type >> 1 & 1) == 0)) &&
           (bVar3 = detail::object_api<pybind11::handle>::is_none
                              ((object_api<pybind11::handle> *)&local_110), bVar3)) {
          bVar4 = true;
          break;
        }
        std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::push_back
                  ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)&call,&local_110);
        if (arg.m_ptr == (PyObject *)0x0) {
          local_589 = true;
        }
        else {
          local_589 = (bool)(*(byte *)&arg.m_ptr[1].ob_type & 1);
        }
        std::vector<bool,_std::allocator<bool>_>::push_back
                  ((vector<bool,_std::allocator<bool>_> *)
                   &call.args.
                    super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,local_589);
      }
      if (bVar4) {
        kwargs.super_object.super_handle.m_ptr._4_4_ = 4;
      }
      else {
        handle::handle(&stack0xfffffffffffffed8,kwargs_in);
        reinterpret_borrow<pybind11::dict>((pybind11 *)&local_120,hStack_128);
        if (pPStack_f8 < call.parent.m_ptr) {
          bVar4 = false;
          for (; pPStack_f8 < call.parent.m_ptr;
              pPStack_f8 = (PyObject *)((long)&pPStack_f8->ob_refcnt + 1)) {
            value.m_ptr = (PyObject *)
                          std::
                          vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                          ::operator[]((vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                        *)(n_args_in + 0x18),pPStack_f8);
            handle::handle(&local_140);
            if ((kwargs_in != (PyObject *)0x0) && ((value.m_ptr)->ob_refcnt != 0)) {
              ppPVar12 = handle::ptr(&local_120);
              pPVar9 = (PyObject *)PyDict_GetItemString(*ppPVar12,(value.m_ptr)->ob_refcnt);
              handle::handle(&local_148,pPVar9);
              local_140.m_ptr = local_148.m_ptr;
            }
            bVar3 = handle::operator_cast_to_bool(&local_140);
            if (bVar3) {
              if (!bVar4) {
                ppPVar12 = handle::ptr(&local_120);
                pPVar9 = (PyObject *)PyDict_Copy(*ppPVar12);
                handle::handle((handle *)&extra_args,pPVar9);
                reinterpret_steal<pybind11::dict>
                          ((pybind11 *)&local_150,(handle)extra_args.super_object.super_handle.m_ptr
                          );
                dict::operator=((dict *)&local_120,&local_150);
                dict::~dict(&local_150);
                bVar4 = true;
              }
              ppPVar12 = handle::ptr(&local_120);
              PyDict_DelItemString(*ppPVar12,(value.m_ptr)->ob_refcnt);
            }
            else {
              bVar3 = handle::operator_cast_to_bool((handle *)(value.m_ptr + 1));
              if (bVar3) {
                local_140.m_ptr = (PyObject *)value.m_ptr[1].ob_refcnt;
              }
            }
            bVar3 = handle::operator_cast_to_bool(&local_140);
            if (!bVar3) break;
            std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::push_back
                      ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)&call,
                       &local_140);
            std::vector<bool,_std::allocator<bool>_>::push_back
                      ((vector<bool,_std::allocator<bool>_> *)
                       &call.args.
                        super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,
                       (bool)(*(byte *)&value.m_ptr[1].ob_type & 1));
          }
          if (call.parent.m_ptr <= pPStack_f8) goto LAB_0015439d;
          kwargs.super_object.super_handle.m_ptr._4_4_ = 4;
        }
        else {
LAB_0015439d:
          bVar4 = handle::operator_cast_to_bool(&local_120);
          if (((bVar4) && (sVar18 = dict::size((dict *)&local_120), sVar18 != 0)) &&
             ((*(byte *)(n_args_in + 0x59) >> 4 & 1) == 0)) {
            kwargs.super_object.super_handle.m_ptr._4_4_ = 4;
          }
          else {
            tuple::tuple((tuple *)&local_160,0);
            if ((*(byte *)(n_args_in + 0x59) >> 3 & 1) != 0) {
              if (pPVar7 == (PyObject *)0x0) {
                handle::handle(&local_170,args_in);
                reinterpret_borrow<pybind11::tuple>((pybind11 *)&local_168,local_170);
                tuple::operator=((tuple *)&local_160,&local_168);
                tuple::~tuple(&local_168);
              }
              else if (pPStack_f8 < parent.m_ptr) {
                local_180 = parent.m_ptr - (long)pPStack_f8;
                tuple::tuple((tuple *)&i,(size_t)local_180);
                tuple::operator=((tuple *)&local_160,(tuple *)&i);
                tuple::~tuple((tuple *)&i);
                for (item.m_ptr = (PyObject *)0x0; item.m_ptr < local_180;
                    item.m_ptr = (PyObject *)((long)&(item.m_ptr)->ob_refcnt + 1)) {
                  iVar5 = PyType_HasFeature(args_in->ob_type,0x4000000);
                  if (iVar5 == 0) {
                    __assert_fail("PyTuple_Check(args_in)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/shibasisp[P]pybind11-examples/pybind11/include/pybind11/pybind11.h"
                                  ,0x21e,
                                  "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                                 );
                  }
                  handle::handle(&local_198,
                                 (PyObject *)
                                 (&args_in[1].ob_type)
                                 [(long)&pPStack_f8->ob_refcnt + (long)item.m_ptr]);
                  phVar14 = handle::inc_ref(&local_198);
                  local_1a0 = handle::ptr(phVar14);
                  tuple::operator[](&local_1c0,(tuple *)&local_160,(size_t)item.m_ptr);
                  detail::accessor<pybind11::detail::accessor_policies::tuple_item>::operator=
                            (&local_1c0,&local_1a0);
                  detail::accessor<pybind11::detail::accessor_policies::tuple_item>::~accessor
                            (&local_1c0);
                }
              }
              else {
                tuple::tuple((tuple *)&args_size,0);
                tuple::operator=((tuple *)&local_160,(tuple *)&args_size);
                tuple::~tuple((tuple *)&args_size);
              }
              std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::push_back
                        ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)&call,
                         &local_160);
              std::vector<bool,_std::allocator<bool>_>::push_back
                        ((vector<bool,_std::allocator<bool>_> *)
                         &call.args.
                          super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,false);
            }
            if ((*(byte *)(n_args_in + 0x59) >> 4 & 1) != 0) {
              ppPVar12 = handle::ptr(&local_120);
              if (*ppPVar12 == (PyObject *)0x0) {
                dict::dict((dict *)&second_pass_convert.super__Bvector_base<std::allocator<bool>_>.
                                    _M_impl.super__Bvector_impl_data._M_end_of_storage);
                dict::operator=((dict *)&local_120,
                                (dict *)&second_pass_convert.
                                         super__Bvector_base<std::allocator<bool>_>._M_impl.
                                         super__Bvector_impl_data._M_end_of_storage);
                dict::~dict((dict *)&second_pass_convert.super__Bvector_base<std::allocator<bool>_>.
                                     _M_impl.super__Bvector_impl_data._M_end_of_storage);
              }
              std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::push_back
                        ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)&call,
                         &local_120);
              std::vector<bool,_std::allocator<bool>_>::push_back
                        ((vector<bool,_std::allocator<bool>_> *)
                         &call.args.
                          super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,false);
            }
            sVar11 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::size
                               ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)&call
                               );
            if ((sVar11 != *(ushort *)(n_args_in + 0x5a)) ||
               (sVar11 = std::vector<bool,_std::allocator<bool>_>::size
                                   ((vector<bool,_std::allocator<bool>_> *)
                                    &call.args.
                                     super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage),
               sVar11 != *(ushort *)(n_args_in + 0x5a))) {
              pybind11_fail(
                           "Internal error: function call dispatcher inserted wrong number of arguments!"
                           );
            }
            std::vector<bool,_std::allocator<bool>_>::vector
                      ((vector<bool,_std::allocator<bool>_> *)local_1f0);
            if (bVar21) {
              std::vector<bool,_std::allocator<bool>_>::resize
                        ((vector<bool,_std::allocator<bool>_> *)local_1f0,
                         (ulong)*(ushort *)(n_args_in + 0x5a),false);
              std::vector<bool,_std::allocator<bool>_>::swap
                        ((vector<bool,_std::allocator<bool>_> *)
                         &call.args.
                          super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,
                         (vector<bool,_std::allocator<bool>_> *)local_1f0);
            }
            anon_var_0 = (reference_cast_error *)(**(code **)(n_args_in + 0x30))(local_d0);
            second_pass.
            super__Vector_base<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)anon_var_0;
            ppPVar12 = handle::ptr((handle *)
                                   &second_pass.
                                    super__Vector_base<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
            if (*ppPVar12 == (PyObject *)0x1) {
              if (bVar21) {
                for (local_210 = (PyObject *)
                                 (long)(int)(uint)((*(byte *)(n_args_in + 0x59) >> 5 & 1) != 0);
                    local_210 < call.parent.m_ptr;
                    local_210 = (PyObject *)((long)&local_210->ob_refcnt + 1)) {
                  rVar22 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                     ((vector<bool,_std::allocator<bool>_> *)local_1f0,
                                      (size_type)local_210);
                  local_218 = rVar22._M_mask;
                  __range3 = (vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
                              *)rVar22._M_p;
                  bVar4 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&__range3);
                  if (bVar4) {
                    std::vector<bool,_std::allocator<bool>_>::swap
                              ((vector<bool,_std::allocator<bool>_> *)
                               &call.args.
                                super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (vector<bool,_std::allocator<bool>_> *)local_1f0);
                    std::
                    vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
                    ::push_back((vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
                                 *)local_68,(value_type *)local_d0);
                    break;
                  }
                }
              }
              kwargs.super_object.super_handle.m_ptr._4_4_ = 0;
            }
            else {
              kwargs.super_object.super_handle.m_ptr._4_4_ = 2;
            }
            std::vector<bool,_std::allocator<bool>_>::~vector
                      ((vector<bool,_std::allocator<bool>_> *)local_1f0);
            tuple::~tuple((tuple *)&local_160);
          }
        }
        dict::~dict((dict *)&local_120);
      }
      detail::function_call::~function_call((function_call *)local_d0);
      if ((kwargs.super_object.super_handle.m_ptr._4_4_ != 0) &&
         (kwargs.super_object.super_handle.m_ptr._4_4_ == 2)) break;
    }
  }
  if (((bVar21) &&
      (bVar21 = std::
                vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
                ::empty((vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
                         *)local_68), !bVar21)) &&
     (ppPVar12 = handle::ptr((handle *)
                             &second_pass.
                              super__Vector_base<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage),
     *ppPVar12 == (PyObject *)0x1)) {
    __end3 = std::
             vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
             ::begin((vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
                      *)local_68);
    call_1 = (function_call *)
             std::
             vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
             ::end((vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
                    *)local_68);
    while (bVar21 = __gnu_cxx::operator!=
                              (&__end3,(__normal_iterator<pybind11::detail::function_call_*,_std::vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>_>
                                        *)&call_1), bVar21) {
      pfVar13 = __gnu_cxx::
                __normal_iterator<pybind11::detail::function_call_*,_std::vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>_>
                ::operator*(&__end3);
      second_pass.
      super__Vector_base<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(*pfVar13->func->impl)(pfVar13);
      ppPVar12 = handle::ptr((handle *)
                             &second_pass.
                              super__Vector_base<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (*ppPVar12 != (PyObject *)0x1) break;
      __gnu_cxx::
      __normal_iterator<pybind11::detail::function_call_*,_std::vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>_>
      ::operator++(&__end3);
    }
  }
  std::vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>::
  ~vector((vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
           *)local_68);
  ppPVar12 = handle::ptr((handle *)
                         &second_pass.
                          super__Vector_base<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (*ppPVar12 == (PyObject *)0x1) {
    if ((*(byte *)((long)puVar6 + 0x59) >> 2 & 1) == 0) {
      pcVar15 = (char *)*puVar6;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_328,pcVar15,&local_329);
      std::operator+(local_308,(char *)local_328);
      pcVar15 = "function";
      if ((*(byte *)((long)puVar6 + 0x59) & 1) != 0) {
        pcVar15 = "constructor";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&ctr,pcVar15,(allocator *)((long)&it2 + 7));
      std::operator+(local_2e8,local_308);
      std::operator+(local_2c8,(char *)local_2e8);
      std::__cxx11::string::~string((string *)local_2e8);
      std::__cxx11::string::~string((string *)&ctr);
      std::allocator<char>::~allocator((allocator<char> *)((long)&it2 + 7));
      std::__cxx11::string::~string((string *)local_308);
      std::__cxx11::string::~string(local_328);
      std::allocator<char>::~allocator((allocator<char> *)&local_329);
      it2._0_4_ = 0;
      for (local_360 = puVar6; local_360 != (undefined8 *)0x0;
          local_360 = (undefined8 *)local_360[0xf]) {
        it2._0_4_ = (int)it2 + 1;
        std::__cxx11::to_string(local_3c0,(int)it2);
        std::operator+((char *)local_3a0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"    ");
        std::operator+(local_380,(char *)local_3a0);
        std::__cxx11::string::operator+=((string *)local_2c8,(string *)local_380);
        std::__cxx11::string::~string((string *)local_380);
        std::__cxx11::string::~string(local_3a0);
        std::__cxx11::string::~string((string *)local_3c0);
        bVar21 = false;
        if ((*(byte *)((long)puVar6 + 0x59) & 1) != 0) {
          pcVar15 = (char *)local_360[2];
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_3e8,pcVar15,(allocator *)((long)&start + 7));
          std::allocator<char>::~allocator((allocator<char> *)((long)&start + 7));
          lVar10 = std::__cxx11::string::find((char)local_3e8,0x28);
          uVar16 = lVar10 + 7;
          uVar17 = std::__cxx11::string::size();
          if (uVar16 < uVar17) {
            next = std::__cxx11::string::find((char *)local_3e8,0x167e1b);
            ret = next + 2;
            args_.super_object.super_handle.m_ptr =
                 (object)std::__cxx11::string::rfind((char *)local_3e8,0x167e1e);
            uVar17 = std::__cxx11::string::size();
            if (uVar17 <= next) {
              ret = std::__cxx11::string::find((char)local_3e8,0x29);
              next = ret;
            }
            if ((uVar16 < next) && (uVar17 = std::__cxx11::string::size(), ret < uVar17)) {
              std::__cxx11::string::append((string *)local_2c8,(ulong)local_3e8,uVar16);
              std::__cxx11::string::operator+=((string *)local_2c8,'(');
              std::__cxx11::string::append((string *)local_2c8,(ulong)local_3e8,ret);
              bVar21 = true;
            }
          }
          std::__cxx11::string::~string(local_3e8);
        }
        if (!bVar21) {
          std::__cxx11::string::operator+=((string *)local_2c8,(char *)local_360[2]);
        }
        std::__cxx11::string::operator+=((string *)local_2c8,"\n");
      }
      std::__cxx11::string::operator+=((string *)local_2c8,"\nInvoked with: ");
      handle::handle(&stack0xfffffffffffffbe0,args_in);
      reinterpret_borrow<pybind11::tuple>((pybind11 *)&local_418,hStack_420);
      ti._7_1_ = 0;
      for (local_430 = (ulong)(int)(uint)((*(byte *)((long)puVar6 + 0x59) & 1) != 0);
          uVar16 = local_430, sVar18 = tuple::size(&local_418), uVar16 < sVar18;
          local_430 = local_430 + 1) {
        if ((ti._7_1_ & 1) == 0) {
          ti._7_1_ = 1;
        }
        else {
          std::__cxx11::string::operator+=((string *)local_2c8,", ");
        }
        tuple::operator[]((tuple_accessor *)&kwargs_1,&local_418,local_430);
        detail::accessor::operator_cast_to_object((accessor *)&local_468);
        local_460 = local_468.m_ptr;
        repr((pybind11 *)&local_458,local_468);
        str::operator_cast_to_string(local_450);
        std::__cxx11::string::operator+=((string *)local_2c8,(string *)local_450);
        std::__cxx11::string::~string((string *)local_450);
        str::~str(&local_458);
        object::~object((object *)&local_468);
        detail::accessor<pybind11::detail::accessor_policies::tuple_item>::~accessor
                  ((accessor<pybind11::detail::accessor_policies::tuple_item> *)&kwargs_1);
      }
      if (kwargs_in != (PyObject *)0x0) {
        handle::handle(&stack0xfffffffffffffb68,kwargs_in);
        reinterpret_borrow<pybind11::dict>((pybind11 *)&local_490,hStack_498);
        sVar18 = dict::size(&local_490);
        if (sVar18 != 0) {
          if ((ti._7_1_ & 1) != 0) {
            std::__cxx11::string::operator+=((string *)local_2c8,"; ");
          }
          std::__cxx11::string::operator+=((string *)local_2c8,"kwargs: ");
          bVar21 = true;
          dict::begin((dict_iterator *)&__end5.super_dict_readonly.pos,&local_490);
          dict::end((dict_iterator *)&kwarg.second,&local_490);
          while (bVar4 = detail::operator!=((It *)&__end5.super_dict_readonly.pos,
                                            (It *)&kwarg.second), bVar4) {
            rVar23 = detail::generic_iterator<pybind11::detail::iterator_policies::dict_readonly>::
                     operator*((generic_iterator<pybind11::detail::iterator_policies::dict_readonly>
                                *)&__end5.super_dict_readonly.pos);
            kwarg.first = rVar23.second.m_ptr;
            local_4f8 = rVar23.first.m_ptr;
            if (bVar21) {
              bVar21 = false;
            }
            else {
              std::__cxx11::string::operator+=((string *)local_2c8,", ");
              rVar23.second.m_ptr = kwarg.first.m_ptr;
              rVar23.first.m_ptr = local_4f8.m_ptr;
            }
            kwarg.first = rVar23.second.m_ptr;
            local_4f8 = rVar23.first.m_ptr;
            str::str((str *)&local_528,"{}={!r}");
            str::format<pybind11::handle&,pybind11::handle&>(&local_520,&local_528,&local_4f8);
            str::operator_cast_to_string(local_518);
            std::__cxx11::string::operator+=((string *)local_2c8,(string *)local_518);
            std::__cxx11::string::~string((string *)local_518);
            str::~str(&local_520);
            str::~str((str *)&local_528);
            detail::generic_iterator<pybind11::detail::iterator_policies::dict_readonly>::operator++
                      ((generic_iterator<pybind11::detail::iterator_policies::dict_readonly> *)
                       &__end5.super_dict_readonly.pos);
          }
        }
        dict::~dict(&local_490);
      }
      uVar2 = _PyExc_TypeError;
      uVar19 = std::__cxx11::string::c_str();
      PyErr_SetString(uVar2,uVar19);
      self_local = (PyObject *)0x0;
      kwargs.super_object.super_handle.m_ptr._4_4_ = 1;
      tuple::~tuple(&local_418);
      std::__cxx11::string::~string((string *)local_2c8);
    }
    else {
      handle::handle(local_2a8,(PyObject *)&_Py_NotImplementedStruct);
      phVar14 = handle::inc_ref(local_2a8);
      self_local = handle::ptr(phVar14);
    }
  }
  else {
    bVar21 = handle::operator_cast_to_bool
                       ((handle *)
                        &second_pass.
                         super__Vector_base<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (bVar21) {
      if ((*(byte *)((long)puVar6 + 0x59) & 1) != 0) {
        ppPVar12 = handle::ptr((handle *)(puVar6 + 0xd));
        ptVar20 = detail::get_type_info((PyTypeObject *)*ppPVar12);
        p_Var1 = ptVar20->init_holder;
        ppPVar12 = handle::ptr(&result);
        (*p_Var1)((instance *)*ppPVar12,(void *)0x0);
      }
      ppPVar12 = handle::ptr((handle *)
                             &second_pass.
                              super__Vector_base<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
      self_local = *ppPVar12;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_548,
                 "Unable to convert function return value to a Python type! The signature was\n\t",
                 (allocator *)((long)&tinfo + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&tinfo + 7));
      std::__cxx11::string::operator+=(local_548,*(char **)(n_args_in + 0x10));
      uVar2 = _PyExc_TypeError;
      uVar19 = std::__cxx11::string::c_str();
      PyErr_SetString(uVar2,uVar19);
      self_local = (PyObject *)0x0;
      kwargs.super_object.super_handle.m_ptr._4_4_ = 1;
      std::__cxx11::string::~string(local_548);
    }
  }
  return self_local;
}

Assistant:

static PyObject *dispatcher(PyObject *self, PyObject *args_in, PyObject *kwargs_in) {
        using namespace detail;

        /* Iterator over the list of potentially admissible overloads */
        function_record *overloads = (function_record *) PyCapsule_GetPointer(self, nullptr),
                        *it = overloads;

        /* Need to know how many arguments + keyword arguments there are to pick the right overload */
        const size_t n_args_in = (size_t) PyTuple_GET_SIZE(args_in);

        handle parent = n_args_in > 0 ? PyTuple_GET_ITEM(args_in, 0) : nullptr,
               result = PYBIND11_TRY_NEXT_OVERLOAD;

        try {
            // We do this in two passes: in the first pass, we load arguments with `convert=false`;
            // in the second, we allow conversion (except for arguments with an explicit
            // py::arg().noconvert()).  This lets us prefer calls without conversion, with
            // conversion as a fallback.
            std::vector<function_call> second_pass;

            // However, if there are no overloads, we can just skip the no-convert pass entirely
            const bool overloaded = it != nullptr && it->next != nullptr;

            for (; it != nullptr; it = it->next) {

                /* For each overload:
                   1. Copy all positional arguments we were given, also checking to make sure that
                      named positional arguments weren't *also* specified via kwarg.
                   2. If we weren't given enough, try to make up the omitted ones by checking
                      whether they were provided by a kwarg matching the `py::arg("name")` name.  If
                      so, use it (and remove it from kwargs; if not, see if the function binding
                      provided a default that we can use.
                   3. Ensure that either all keyword arguments were "consumed", or that the function
                      takes a kwargs argument to accept unconsumed kwargs.
                   4. Any positional arguments still left get put into a tuple (for args), and any
                      leftover kwargs get put into a dict.
                   5. Pack everything into a vector; if we have py::args or py::kwargs, they are an
                      extra tuple or dict at the end of the positional arguments.
                   6. Call the function call dispatcher (function_record::impl)

                   If one of these fail, move on to the next overload and keep trying until we get a
                   result other than PYBIND11_TRY_NEXT_OVERLOAD.
                 */

                function_record &func = *it;
                size_t pos_args = func.nargs;    // Number of positional arguments that we need
                if (func.has_args) --pos_args;   // (but don't count py::args
                if (func.has_kwargs) --pos_args; //  or py::kwargs)

                if (!func.has_args && n_args_in > pos_args)
                    continue; // Too many arguments for this overload

                if (n_args_in < pos_args && func.args.size() < pos_args)
                    continue; // Not enough arguments given, and not enough defaults to fill in the blanks

                function_call call(func, parent);

                size_t args_to_copy = std::min(pos_args, n_args_in);
                size_t args_copied = 0;

                // 1. Copy any position arguments given.
                bool bad_arg = false;
                for (; args_copied < args_to_copy; ++args_copied) {
                    argument_record *arg_rec = args_copied < func.args.size() ? &func.args[args_copied] : nullptr;
                    if (kwargs_in && arg_rec && arg_rec->name && PyDict_GetItemString(kwargs_in, arg_rec->name)) {
                        bad_arg = true;
                        break;
                    }

                    handle arg(PyTuple_GET_ITEM(args_in, args_copied));
                    if (arg_rec && !arg_rec->none && arg.is_none()) {
                        bad_arg = true;
                        break;
                    }
                    call.args.push_back(arg);
                    call.args_convert.push_back(arg_rec ? arg_rec->convert : true);
                }
                if (bad_arg)
                    continue; // Maybe it was meant for another overload (issue #688)

                // We'll need to copy this if we steal some kwargs for defaults
                dict kwargs = reinterpret_borrow<dict>(kwargs_in);

                // 2. Check kwargs and, failing that, defaults that may help complete the list
                if (args_copied < pos_args) {
                    bool copied_kwargs = false;

                    for (; args_copied < pos_args; ++args_copied) {
                        const auto &arg = func.args[args_copied];

                        handle value;
                        if (kwargs_in && arg.name)
                            value = PyDict_GetItemString(kwargs.ptr(), arg.name);

                        if (value) {
                            // Consume a kwargs value
                            if (!copied_kwargs) {
                                kwargs = reinterpret_steal<dict>(PyDict_Copy(kwargs.ptr()));
                                copied_kwargs = true;
                            }
                            PyDict_DelItemString(kwargs.ptr(), arg.name);
                        } else if (arg.value) {
                            value = arg.value;
                        }

                        if (value) {
                            call.args.push_back(value);
                            call.args_convert.push_back(arg.convert);
                        }
                        else
                            break;
                    }

                    if (args_copied < pos_args)
                        continue; // Not enough arguments, defaults, or kwargs to fill the positional arguments
                }

                // 3. Check everything was consumed (unless we have a kwargs arg)
                if (kwargs && kwargs.size() > 0 && !func.has_kwargs)
                    continue; // Unconsumed kwargs, but no py::kwargs argument to accept them

                // 4a. If we have a py::args argument, create a new tuple with leftovers
                tuple extra_args;
                if (func.has_args) {
                    if (args_to_copy == 0) {
                        // We didn't copy out any position arguments from the args_in tuple, so we
                        // can reuse it directly without copying:
                        extra_args = reinterpret_borrow<tuple>(args_in);
                    } else if (args_copied >= n_args_in) {
                        extra_args = tuple(0);
                    } else {
                        size_t args_size = n_args_in - args_copied;
                        extra_args = tuple(args_size);
                        for (size_t i = 0; i < args_size; ++i) {
                            handle item = PyTuple_GET_ITEM(args_in, args_copied + i);
                            extra_args[i] = item.inc_ref().ptr();
                        }
                    }
                    call.args.push_back(extra_args);
                    call.args_convert.push_back(false);
                }

                // 4b. If we have a py::kwargs, pass on any remaining kwargs
                if (func.has_kwargs) {
                    if (!kwargs.ptr())
                        kwargs = dict(); // If we didn't get one, send an empty one
                    call.args.push_back(kwargs);
                    call.args_convert.push_back(false);
                }

                // 5. Put everything in a vector.  Not technically step 5, we've been building it
                // in `call.args` all along.
                #if !defined(NDEBUG)
                if (call.args.size() != func.nargs || call.args_convert.size() != func.nargs)
                    pybind11_fail("Internal error: function call dispatcher inserted wrong number of arguments!");
                #endif

                std::vector<bool> second_pass_convert;
                if (overloaded) {
                    // We're in the first no-convert pass, so swap out the conversion flags for a
                    // set of all-false flags.  If the call fails, we'll swap the flags back in for
                    // the conversion-allowed call below.
                    second_pass_convert.resize(func.nargs, false);
                    call.args_convert.swap(second_pass_convert);
                }

                // 6. Call the function.
                try {
                    result = func.impl(call);
                } catch (reference_cast_error &) {
                    result = PYBIND11_TRY_NEXT_OVERLOAD;
                }

                if (result.ptr() != PYBIND11_TRY_NEXT_OVERLOAD)
                    break;

                if (overloaded) {
                    // The (overloaded) call failed; if the call has at least one argument that
                    // permits conversion (i.e. it hasn't been explicitly specified `.noconvert()`)
                    // then add this call to the list of second pass overloads to try.
                    for (size_t i = func.is_method ? 1 : 0; i < pos_args; i++) {
                        if (second_pass_convert[i]) {
                            // Found one: swap the converting flags back in and store the call for
                            // the second pass.
                            call.args_convert.swap(second_pass_convert);
                            second_pass.push_back(std::move(call));
                            break;
                        }
                    }
                }
            }

            if (overloaded && !second_pass.empty() && result.ptr() == PYBIND11_TRY_NEXT_OVERLOAD) {
                // The no-conversion pass finished without success, try again with conversion allowed
                for (auto &call : second_pass) {
                    try {
                        result = call.func.impl(call);
                    } catch (reference_cast_error &) {
                        result = PYBIND11_TRY_NEXT_OVERLOAD;
                    }

                    if (result.ptr() != PYBIND11_TRY_NEXT_OVERLOAD)
                        break;
                }
            }
        } catch (error_already_set &e) {
            e.restore();
            return nullptr;
        } catch (...) {
            /* When an exception is caught, give each registered exception
               translator a chance to translate it to a Python exception
               in reverse order of registration.

               A translator may choose to do one of the following:

                - catch the exception and call PyErr_SetString or PyErr_SetObject
                  to set a standard (or custom) Python exception, or
                - do nothing and let the exception fall through to the next translator, or
                - delegate translation to the next translator by throwing a new type of exception. */

            auto last_exception = std::current_exception();
            auto &registered_exception_translators = get_internals().registered_exception_translators;
            for (auto& translator : registered_exception_translators) {
                try {
                    translator(last_exception);
                } catch (...) {
                    last_exception = std::current_exception();
                    continue;
                }
                return nullptr;
            }
            PyErr_SetString(PyExc_SystemError, "Exception escaped from default exception translator!");
            return nullptr;
        }

        if (result.ptr() == PYBIND11_TRY_NEXT_OVERLOAD) {
            if (overloads->is_operator)
                return handle(Py_NotImplemented).inc_ref().ptr();

            std::string msg = std::string(overloads->name) + "(): incompatible " +
                std::string(overloads->is_constructor ? "constructor" : "function") +
                " arguments. The following argument types are supported:\n";

            int ctr = 0;
            for (function_record *it2 = overloads; it2 != nullptr; it2 = it2->next) {
                msg += "    "+ std::to_string(++ctr) + ". ";

                bool wrote_sig = false;
                if (overloads->is_constructor) {
                    // For a constructor, rewrite `(self: Object, arg0, ...) -> NoneType` as `Object(arg0, ...)`
                    std::string sig = it2->signature;
                    size_t start = sig.find('(') + 7; // skip "(self: "
                    if (start < sig.size()) {
                        // End at the , for the next argument
                        size_t end = sig.find(", "), next = end + 2;
                        size_t ret = sig.rfind(" -> ");
                        // Or the ), if there is no comma:
                        if (end >= sig.size()) next = end = sig.find(')');
                        if (start < end && next < sig.size()) {
                            msg.append(sig, start, end - start);
                            msg += '(';
                            msg.append(sig, next, ret - next);
                            wrote_sig = true;
                        }
                    }
                }
                if (!wrote_sig) msg += it2->signature;

                msg += "\n";
            }
            msg += "\nInvoked with: ";
            auto args_ = reinterpret_borrow<tuple>(args_in);
            bool some_args = false;
            for (size_t ti = overloads->is_constructor ? 1 : 0; ti < args_.size(); ++ti) {
                if (!some_args) some_args = true;
                else msg += ", ";
                msg += pybind11::repr(args_[ti]);
            }
            if (kwargs_in) {
                auto kwargs = reinterpret_borrow<dict>(kwargs_in);
                if (kwargs.size() > 0) {
                    if (some_args) msg += "; ";
                    msg += "kwargs: ";
                    bool first = true;
                    for (auto kwarg : kwargs) {
                        if (first) first = false;
                        else msg += ", ";
                        msg += pybind11::str("{}={!r}").format(kwarg.first, kwarg.second);
                    }
                }
            }

            PyErr_SetString(PyExc_TypeError, msg.c_str());
            return nullptr;
        } else if (!result) {
            std::string msg = "Unable to convert function return value to a "
                              "Python type! The signature was\n\t";
            msg += it->signature;
            PyErr_SetString(PyExc_TypeError, msg.c_str());
            return nullptr;
        } else {
            if (overloads->is_constructor) {
                auto tinfo = get_type_info((PyTypeObject *) overloads->scope.ptr());
                tinfo->init_holder(reinterpret_cast<instance *>(parent.ptr()), nullptr);
            }
            return result.ptr();
        }
    }